

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O0

Transaction * __thiscall LinkedList<Transaction_*>::at(LinkedList<Transaction_*> *this,int index)

{
  ostream *this_00;
  int local_24;
  Node<Transaction_*> *pNStack_20;
  int i;
  Node<Transaction_*> *currNode;
  int index_local;
  LinkedList<Transaction_*> *this_local;
  
  pNStack_20 = this->head;
  if ((index < this->size) && (-1 < index)) {
    for (local_24 = 0; local_24 < index; local_24 = local_24 + 1) {
      pNStack_20 = pNStack_20->next;
    }
    return pNStack_20->data;
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Index out of range");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

T LinkedList<T>::at(int index)
{
    auto currNode = this->head;

    if(index >= size || index < 0)
    {
        std::cout << "Index out of range" << std::endl;
        exit(1);
    }
    else {
        for (int i = 0; i < index; i++) {
            currNode = currNode->next;
        }
        return currNode->data;
    }
}